

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::SrcDir_abi_cxx11_(void)

{
  size_type_conflict sVar1;
  string *in_RDI;
  char in_R9B;
  initializer_list<const_char_*> environment_variables;
  string local_48 [32];
  char *local_28;
  testing *local_20;
  iterator local_18;
  
  local_28 = "TEST_SRCDIR";
  local_20 = (testing *)&local_28;
  local_18 = (iterator)0x1;
  GetCurrentExecutableDirectory_abi_cxx11_();
  sVar1 = std::__cxx11::string::c_str();
  environment_variables._M_len = sVar1;
  environment_variables._M_array = local_18;
  GetDirFromEnv_abi_cxx11_(in_RDI,local_20,environment_variables,(char *)0x2f,in_R9B);
  std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

std::string SrcDir() {
#if defined(GTEST_CUSTOM_SRCDIR_FUNCTION_)
  return GTEST_CUSTOM_SRCDIR_FUNCTION_();
#elif defined(GTEST_OS_WINDOWS) || defined(GTEST_OS_WINDOWS_MOBILE)
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '\\');
#elif defined(GTEST_OS_LINUX_ANDROID)
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '/');
#else
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '/');
#endif
}